

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::iterate(UserDefinedIOCase *this)

{
  ostream *this_00;
  IOType IVar1;
  uint uVar2;
  RenderContext *pRVar3;
  Archive *archive;
  TopLevelObject *pTVar4;
  undefined8 *puVar5;
  TextureFormat TVar6;
  pointer puVar7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  int iVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ObjectTraits *pOVar13;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar14;
  long *plVar15;
  TextureFormat *pTVar16;
  pointer pSVar17;
  TestError *pTVar18;
  long *plVar19;
  TextureFormat TVar20;
  ulong *puVar21;
  ulong uVar22;
  void *pvVar23;
  long lVar24;
  ostringstream *poVar25;
  uint uVar26;
  uint uVar27;
  Surface pixels;
  RandomViewport viewport;
  Result tfResult;
  TFHandler tfHandler;
  VertexArrayBinding bindings [1];
  TextureLevel reference;
  ResultCollector result;
  undefined1 local_400 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  ulong local_3d8;
  Surface local_3d0;
  long lStack_3b8;
  RandomViewport local_3b0;
  TextureFormat local_3a0;
  PrimitiveType local_398;
  deUint32 local_394;
  undefined1 local_390 [16];
  long local_380;
  TextureFormat TStack_378;
  RenderContext *local_368;
  PrimitiveType local_360;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_358;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_340;
  TextureFormat local_328;
  TextureFormat local_320;
  long local_318;
  TextureFormat TStack_310;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  void **local_2e8;
  long local_2e0;
  void *local_2d8 [2];
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8;
  undefined7 uStack_2b7;
  RenderContext *local_2a8;
  ObjectWrapper local_2a0;
  ObjectWrapper local_288;
  ObjectWrapper local_270;
  undefined1 local_258 [8];
  _Alloc_hider local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  int local_230;
  VertexArrayPointer local_228;
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  int local_1d8;
  ios_base local_190 [8];
  ios_base local_188 [264];
  ResultCollector local_80;
  
  local_3a0 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  pRVar3 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar9 = (*pRVar3->_vptr_RenderContext[4])(pRVar3);
  dVar10 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_3b0,(RenderTarget *)CONCAT44(extraout_var,iVar9),0x100,0x100,dVar10);
  iVar9 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  lVar24 = CONCAT44(extraout_var_00,iVar9);
  dVar10 = (((this->m_program).m_ptr)->m_program).m_program;
  iVar9 = referenceVertexCount
                    (this->m_primitiveType,SPACINGMODE_EQUAL,false,iterate::attributes,
                     iterate::attributes + 2);
  local_3d8 = CONCAT44(extraout_var_01,iVar9);
  local_2a8 = pRVar3;
  iVar9 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  pOVar13 = glu::objectTraits(OBJECTTYPE_TRANSFORM_FEEDBACK);
  glu::ObjectWrapper::ObjectWrapper(&local_2a0,(Functions *)CONCAT44(extraout_var_02,iVar9),pOVar13)
  ;
  local_368 = pRVar3;
  iVar9 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  pOVar13 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_288,(Functions *)CONCAT44(extraout_var_03,iVar9),pOVar13)
  ;
  iVar9 = (*local_368->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_QUERY);
  glu::ObjectWrapper::ObjectWrapper(&local_270,(Functions *)CONCAT44(extraout_var_04,iVar9),pOVar13)
  ;
  iVar9 = (*local_2a8->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_05,iVar9) + 0x40))(0x8c8e,local_288.m_object);
  (**(code **)(CONCAT44(extraout_var_05,iVar9) + 0x150))
            (0x8c8e,(long)((int)local_3d8 * 4 + 0xc),0,0x88e9);
  tcu::ResultCollector::ResultCollector(&local_80);
  (**(code **)(lVar24 + 0x1680))(dVar10);
  (**(code **)(lVar24 + 0x1a00))(local_3b0.x,local_3b0.y,local_3b0.width,local_3b0.height);
  (**(code **)(lVar24 + 0xfd8))(0x8e72,10);
  (**(code **)(lVar24 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar24 + 0x188))(0x4000);
  local_400._0_8_ = &local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"in_v_attr","");
  local_200._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_200._8_8_ = local_1f0._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_200 + 8),local_400._0_8_,(pointer)(local_400._8_8_ + local_400._0_8_))
  ;
  local_1d8 = 0;
  local_258._0_4_ = local_200._0_4_;
  local_250._M_p = (pointer)&local_240;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,local_200._8_8_,
             (char *)(local_200._8_8_ + local_1f0._M_allocated_capacity));
  local_230 = local_1d8;
  local_228.componentType = VTX_COMP_FLOAT;
  local_228.convert = VTX_COMP_CONVERT_NONE;
  local_228.numComponents = 1;
  local_228.numElements = 10;
  local_228.stride = 0;
  local_228.data = iterate::attributes;
  if ((char *)local_200._8_8_ != local_1f0._M_local_buf + 8) {
    operator_delete((void *)local_200._8_8_,local_1f0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._0_8_ != &local_3f0) {
    operator_delete((void *)local_400._0_8_,local_3f0._M_allocated_capacity + 1);
  }
  uVar26 = 0xffffffff;
  if ((ulong)this->m_primitiveType < 3) {
    uVar26 = *(uint *)(&DAT_0096cc60 + (ulong)this->m_primitiveType * 4);
  }
  iVar9 = (*local_2a8->_vptr_RenderContext[3])();
  lVar24 = CONCAT44(extraout_var_06,iVar9);
  (**(code **)(lVar24 + 0xd0))(0x8e22,local_2a0.m_object);
  (**(code **)(lVar24 + 0x40))(0x8c8e,local_288.m_object);
  (**(code **)(lVar24 + 0x48))(0x8c8e,0,local_288.m_object);
  (**(code **)(lVar24 + 0x20))(0x8c88,local_270.m_object);
  (**(code **)(lVar24 + 0x30))(uVar26);
  local_200._0_4_ = RGB;
  local_200._4_4_ = UNORM_SHORT_4444;
  local_200._8_4_ = INDEXTYPE_LAST;
  local_1f0._M_allocated_capacity = 0;
  glu::draw(local_2a8,dVar10,1,(VertexArrayBinding *)local_258,(PrimitiveList *)local_200,
            (DrawUtilCallback *)0x0);
  dVar10 = (**(code **)(lVar24 + 0x800))();
  glu::checkError(dVar10,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x15e);
  (**(code **)(lVar24 + 0x638))();
  (**(code **)(lVar24 + 0x628))(0x8c88);
  local_200._0_4_ = ~R;
  (**(code **)(lVar24 + 0xa20))(local_270.m_object);
  if (local_200._0_4_ == ~PRIMITIVETYPE_TRIANGLES) {
    pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar18,(char *)0x0,"result != (deUint32)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0x104);
    __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar9 = -1;
  if (uVar26 < 5) {
    iVar9 = (&DAT_0096cc6c)[uVar26];
  }
  local_398 = local_200._0_4_;
  uVar26 = iVar9 * local_200._0_4_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_340,(long)(int)uVar26,(allocator_type *)local_200);
  puVar7 = local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar14 = (**(code **)(lVar24 + 0xd00))(0x8c8e,0,(long)(int)(uVar26 * 4),1);
  local_394 = (**(code **)(lVar24 + 0x800))();
  local_2c8 = &local_2b8;
  local_2c0 = 0;
  local_2b8 = 0;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  local_308 = &local_2f8;
  plVar19 = plVar15 + 2;
  if ((long *)*plVar15 == plVar19) {
    local_2f8 = *plVar19;
    lStack_2f0 = plVar15[3];
  }
  else {
    local_2f8 = *plVar19;
    local_308 = (long *)*plVar15;
  }
  local_300 = plVar15[1];
  *plVar15 = (long)plVar19;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  glu::getBufferTargetName(0x8c8e);
  pTVar16 = (TextureFormat *)std::__cxx11::string::append((char *)&local_308);
  local_328 = (TextureFormat)&local_318;
  TVar20 = (TextureFormat)(pTVar16 + 2);
  if (*pTVar16 == TVar20) {
    local_318 = *(long *)TVar20;
    TStack_310 = pTVar16[3];
  }
  else {
    local_318 = *(long *)TVar20;
    local_328 = *pTVar16;
  }
  local_320 = pTVar16[1];
  *pTVar16 = TVar20;
  pTVar16[1].order = R;
  pTVar16[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar16[2].order = R;
  plVar15 = (long *)std::__cxx11::string::append((char *)&local_328);
  puVar5 = &local_3d0.m_pixels.m_cap;
  puVar21 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar21) {
    local_3d0.m_pixels.m_cap = *puVar21;
    lStack_3b8 = plVar15[3];
    local_3d0._0_8_ = puVar5;
  }
  else {
    local_3d0.m_pixels.m_cap = *puVar21;
    local_3d0._0_8_ = (ulong *)*plVar15;
  }
  local_3d0.m_pixels.m_ptr = (void *)plVar15[1];
  *plVar15 = (long)puVar21;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
  std::ostream::operator<<(local_200,uVar26 * 4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  std::ios_base::~ios_base(local_190);
  pvVar23 = (void *)0xf;
  if ((undefined8 *)local_3d0._0_8_ != puVar5) {
    pvVar23 = (void *)local_3d0.m_pixels.m_cap;
  }
  if (pvVar23 < (void *)(local_2e0 + (long)local_3d0.m_pixels.m_ptr)) {
    pvVar23 = (void *)0xf;
    if (local_2e8 != local_2d8) {
      pvVar23 = local_2d8[0];
    }
    if ((void *)(local_2e0 + (long)local_3d0.m_pixels.m_ptr) <= pvVar23) {
      pTVar16 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,local_3d0._0_8_);
      goto LAB_003f813b;
    }
  }
  pTVar16 = (TextureFormat *)std::__cxx11::string::_M_append((char *)&local_3d0,(ulong)local_2e8);
LAB_003f813b:
  local_390._0_8_ = &local_380;
  TVar20 = (TextureFormat)(pTVar16 + 2);
  if (*pTVar16 == TVar20) {
    local_380 = *(long *)TVar20;
    TStack_378 = pTVar16[3];
  }
  else {
    local_380 = *(long *)TVar20;
    local_390._0_8_ = *pTVar16;
  }
  local_390._8_8_ = pTVar16[1];
  *pTVar16 = TVar20;
  pTVar16[1].order = R;
  pTVar16[1].type = SNORM_INT8;
  *(undefined1 *)TVar20 = 0;
  pTVar16 = (TextureFormat *)std::__cxx11::string::append(local_390);
  local_400._0_8_ = &local_3f0;
  TVar20 = (TextureFormat)(pTVar16 + 2);
  if (*pTVar16 == TVar20) {
    local_3f0._M_allocated_capacity = *(undefined8 *)TVar20;
    local_3f0._8_8_ = pTVar16[3];
  }
  else {
    local_3f0._M_allocated_capacity = *(undefined8 *)TVar20;
    local_400._0_8_ = *pTVar16;
  }
  local_400._8_8_ = pTVar16[1];
  *pTVar16 = TVar20;
  pTVar16[1].order = R;
  pTVar16[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar16[2].order = R;
  glu::checkError(local_394,(char *)local_400._0_8_,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x10d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._0_8_ != &local_3f0) {
    operator_delete((void *)local_400._0_8_,local_3f0._M_allocated_capacity + 1);
  }
  if ((long *)local_390._0_8_ != &local_380) {
    operator_delete((void *)local_390._0_8_,local_380 + 1);
  }
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,(long)local_2d8[0] + 1);
  }
  if ((undefined8 *)local_3d0._0_8_ != puVar5) {
    operator_delete((void *)local_3d0._0_8_,local_3d0.m_pixels.m_cap + 1);
  }
  if (local_328 != (TextureFormat)&local_318) {
    operator_delete((void *)local_328,local_318 + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  TVar20 = local_3a0;
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,CONCAT71(uStack_2b7,local_2b8) + 1);
  }
  if (lVar14 == 0) {
    pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar18,(char *)0x0,"mappedData != DE_NULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0x10e);
    __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (0 < (int)uVar26) {
    uVar22 = 0;
    do {
      puVar7[uVar22] = *(uint *)(lVar14 + uVar22 * 4);
      uVar22 = uVar22 + 1;
    } while (uVar26 != uVar22);
  }
  (**(code **)(lVar24 + 0x1670))(0x8c8e);
  local_360 = local_398;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_358,&local_340);
  if (local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  getPixels(&local_3d0,local_368,local_3b0.x,local_3b0.y,local_3b0.width,local_3b0.height);
  archive = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_400,(this->m_referenceImagePath)._M_dataplus._M_p,
             (allocator<char> *)local_390);
  getPNG((TextureLevel *)local_200,archive,(string *)local_400);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._0_8_ != &local_3f0) {
    operator_delete((void *)local_400._0_8_,local_3f0._M_allocated_capacity + 1);
  }
  tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_400,(TextureLevel *)local_200);
  local_328.order = RGBA;
  local_328.type = UNORM_INT8;
  pvVar23 = (void *)local_3d0.m_pixels.m_cap;
  if ((void *)local_3d0.m_pixels.m_cap != (void *)0x0) {
    pvVar23 = local_3d0.m_pixels.m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_390,&local_328,local_3d0.m_width,local_3d0.m_height,1,
             pvVar23);
  bVar8 = tcu::fuzzyCompare((TestLog *)TVar20,"ImageComparison","Image Comparison",
                            (ConstPixelBufferAccess *)local_400,(ConstPixelBufferAccess *)local_390,
                            0.02,COMPARE_LOG_RESULT);
  if (!bVar8) {
    local_400._0_8_ = &local_3f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_400,"Image comparison failed","");
    tcu::ResultCollector::fail(&local_80,(string *)local_400);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._0_8_ != &local_3f0) {
      operator_delete((void *)local_400._0_8_,local_3f0._M_allocated_capacity + 1);
    }
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_200);
  tcu::Surface::~Surface(&local_3d0);
  TVar6 = local_3a0;
  if ((int)local_3d8 ==
      (int)((ulong)((long)local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 2)) {
    IVar1 = this->m_ioType;
    if ((ulong)IVar1 < 3) {
      uVar26 = *(uint *)(&DAT_0096cc80 + (ulong)IVar1 * 4);
    }
    else {
      uVar26 = (uint)(IVar1 != IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 3 + 2;
    }
    pSVar17 = (this->m_tesInputs).
              super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->m_tesInputs).
                            super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar17) >> 4) < 1) {
      iVar9 = 0;
    }
    else {
      lVar14 = 0;
      lVar24 = 0;
      iVar9 = 0;
      do {
        iVar11 = (**(code **)(**(long **)((long)&pSVar17->m_ptr + lVar14) + 0x38))();
        iVar9 = iVar9 + iVar11;
        lVar24 = lVar24 + 1;
        pSVar17 = (this->m_tesInputs).
                  super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar14 = lVar14 + 0x10;
      } while (lVar24 < (int)((ulong)((long)(this->m_tesInputs).
                                            super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar17) >> 4));
    }
    if (0 < (int)local_3d8) {
      uVar27 = iVar9 * uVar26;
      local_3d8 = local_3d8 & 0xffffffff;
      uVar22 = 0;
      do {
        poVar25 = (ostringstream *)(local_200 + 8);
        if (uVar27 < local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar22]) {
          local_200._0_4_ = local_3a0.order;
          local_200._4_4_ = local_3a0.type;
          std::__cxx11::ostringstream::ostringstream(poVar25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25,"Failure: out_te_firstFailedInputIndex has value ",0x30);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25,", should be in range [0, ",0x19);
          std::ostream::operator<<(poVar25,uVar27);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"]",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar25);
          std::ios_base::~ios_base(local_188);
          local_200._0_8_ = &local_1f0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_200,"Invalid transform feedback output","");
          tcu::ResultCollector::fail(&local_80,(string *)local_200);
LAB_003f88dd:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._0_8_ != &local_1f0) {
            operator_delete((void *)local_200._0_8_,local_1f0._M_allocated_capacity + 1);
          }
        }
        else if (local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar22] != uVar27) {
          local_200._0_4_ = local_3a0.order;
          local_200._4_4_ = local_3a0.type;
          std::__cxx11::ostringstream::ostringstream(poVar25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar25,
                     "Failure: in tessellation evaluation shader, check for input ",0x3c);
          uVar2 = local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar22];
          if ((int)uVar2 < 1) {
            iVar9 = 0;
            iVar11 = 0;
          }
          else {
            iVar11 = 0;
            iVar9 = 0;
            do {
              iVar12 = (*((this->m_tesInputs).
                          super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar11].m_ptr)->
                         _vptr_TopLevelObject[7])();
              iVar9 = iVar9 + iVar12 * uVar26;
              iVar11 = iVar11 + 1;
            } while (iVar9 < (int)uVar2);
          }
          if ((int)uVar2 < iVar9) {
            iVar11 = iVar11 + -1;
            iVar12 = (*((this->m_tesInputs).
                        super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar11].m_ptr)->
                       _vptr_TopLevelObject[7])();
            iVar9 = iVar9 - iVar12 * uVar26;
          }
          pTVar4 = (this->m_tesInputs).
                   super__Vector_base<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>,_std::allocator<de::SharedPtr<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::TopLevelObject>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar11].m_ptr;
          (*pTVar4->_vptr_TopLevelObject[8])(local_400,pTVar4,(ulong)(uVar2 - iVar9),(ulong)uVar26);
          this_00 = (ostream *)(local_200 + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (this_00,(char *)local_400._0_8_,local_400._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(this_00," failed",7);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._0_8_ != &local_3f0) {
            operator_delete((void *)local_400._0_8_,local_3f0._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
          std::ios_base::~ios_base(local_188);
          local_200._0_8_ = &local_1f0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_200,"Invalid input value in tessellation evaluation shader","")
          ;
          tcu::ResultCollector::fail(&local_80,(string *)local_200);
          goto LAB_003f88dd;
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != local_3d8);
    }
  }
  else {
    poVar25 = (ostringstream *)(local_200 + 8);
    local_3a0.order = TVar20.order;
    local_3a0.type = TVar20.type;
    local_200._0_4_ = local_3a0.order;
    local_200._4_4_ = local_3a0.type;
    local_3a0 = TVar6;
    std::__cxx11::ostringstream::ostringstream(poVar25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar25,"Failure: transform feedback returned ",0x25);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar25," vertices; expected ",0x14);
    std::ostream::operator<<(poVar25,(int)local_3d8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar25);
    std::ios_base::~ios_base(local_188);
    local_200._0_8_ = &local_1f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,"Wrong number of vertices","");
    tcu::ResultCollector::fail(&local_80,(string *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &local_1f0) {
      operator_delete((void *)local_200._0_8_,local_1f0._M_allocated_capacity + 1);
    }
  }
  if (local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_p != &local_240) {
    operator_delete(local_250._M_p,local_240._M_allocated_capacity + 1);
  }
  tcu::ResultCollector::setTestContextResult
            (&local_80,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_270);
  glu::ObjectWrapper::~ObjectWrapper(&local_288);
  glu::ObjectWrapper::~ObjectWrapper(&local_2a0);
  return STOP;
}

Assistant:

UserDefinedIOCase::IterateResult UserDefinedIOCase::iterate (void)
{
	typedef TransformFeedbackHandler<deUint32> TFHandler;

	TestLog&				log						= m_testCtx.getLog();
	const RenderContext&	renderCtx				= m_context.getRenderContext();
	const RandomViewport	viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&	gl						= renderCtx.getFunctions();
	static const float		attributes[6+2+2]		= { /* inner */ 3.0f, 4.0f, /* outer */ 5.0f, 6.0f, 7.0f, 8.0f, /* pos. scale */ 1.2f, 1.3f, /* pos. offset */ -0.3f, -0.4f };
	const deUint32			programGL				= m_program->getProgram();
	const int				numVertices				= referenceVertexCount(m_primitiveType, SPACINGMODE_EQUAL, false, &attributes[0], &attributes[2]);
	const TFHandler			tfHandler				(renderCtx, numVertices);
	tcu::ResultCollector	result;

	gl.useProgram(programGL);
	setViewport(gl, viewport);
	gl.patchParameteri(GL_PATCH_VERTICES, DE_LENGTH_OF_ARRAY(attributes));

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	{
		const glu::VertexArrayBinding	bindings[]	= { glu::va::Float("in_v_attr", 1, DE_LENGTH_OF_ARRAY(attributes), 0, &attributes[0]) };
		const TFHandler::Result			tfResult	= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, false),
																					   DE_LENGTH_OF_ARRAY(bindings), &bindings[0], DE_LENGTH_OF_ARRAY(attributes));

		{
			const tcu::Surface			pixels		= getPixels(renderCtx, viewport);
			const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePath.c_str());
			const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), pixels.getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);

			if (!success)
				result.fail("Image comparison failed");
		}

		if ((int)tfResult.varying.size() != numVertices)
		{
			log << TestLog::Message << "Failure: transform feedback returned " << tfResult.varying.size() << " vertices; expected " << numVertices << TestLog::EndMessage;
			result.fail("Wrong number of vertices");
		}
		else
		{
			const int topLevelArraySize		= (m_ioType == IO_TYPE_PER_PATCH				? 1
											 : m_ioType == IO_TYPE_PER_PATCH_ARRAY			? NUM_PER_PATCH_ARRAY_ELEMS
											 : m_ioType == IO_TYPE_PER_PATCH_BLOCK			? 1
											 : m_ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
											 : (int)NUM_OUTPUT_VERTICES);
			const int numTEInputs			= numBasicSubobjectsInElementType(m_tesInputs) * topLevelArraySize;

			for (int vertexNdx = 0; vertexNdx < (int)numVertices; vertexNdx++)
			{
				if (tfResult.varying[vertexNdx] > (deUint32)numTEInputs)
				{
					log << TestLog::Message << "Failure: out_te_firstFailedInputIndex has value " << tfResult.varying[vertexNdx]
											<< ", should be in range [0, " << numTEInputs << "]" << TestLog::EndMessage;
					result.fail("Invalid transform feedback output");
				}
				else if (tfResult.varying[vertexNdx] != (deUint32)numTEInputs)
				{
					log << TestLog::Message << "Failure: in tessellation evaluation shader, check for input "
											<< basicSubobjectAtIndex(tfResult.varying[vertexNdx], m_tesInputs, topLevelArraySize) << " failed" << TestLog::EndMessage;
					result.fail("Invalid input value in tessellation evaluation shader");
				}
			}
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}